

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O3

int deqp::gles31::bb::anon_unknown_11::computeReferenceLayout
              (BufferLayout *layout,int curBlockNdx,int baseOffset,string *curPrefix,VarType *type,
              deUint32 layoutFlags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DataType DVar2;
  VarType *pVVar3;
  pointer pcVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  undefined8 *puVar8;
  long *plVar9;
  size_type *psVar10;
  ulong *puVar11;
  ulong uVar12;
  uint baseOffset_00;
  ulong uVar13;
  pointer pSVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  BufferVarLayoutEntry entry;
  string local_258;
  BufferLayout *local_238;
  string *local_230;
  ulong local_228;
  VarType *local_220;
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  long *local_1f8;
  undefined8 local_1f0;
  long local_1e8;
  undefined8 uStack_1e0;
  uint local_1d4;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0 [2];
  ulong local_1b0;
  value_type local_1a8;
  ios_base local_138 [264];
  
  uVar12 = (ulong)(uint)baseOffset;
  local_238 = layout;
  local_230 = curPrefix;
  if ((layoutFlags & 4) == 0) {
    uVar5 = computeStd430BaseAlignment(type,layoutFlags);
  }
  else {
    uVar5 = computeStd140BaseAlignment(type,layoutFlags);
  }
  uVar13 = (ulong)uVar5;
  local_1d4 = -uVar5;
  baseOffset_00 = (baseOffset + uVar5) - 1 & local_1d4;
  local_220 = (VarType *)CONCAT44(local_220._4_4_,layoutFlags);
  local_1b0 = uVar12;
  if (type->m_type == TYPE_ARRAY) {
    pVVar3 = (type->m_data).array.elementType;
    if (pVVar3->m_type != TYPE_BASIC) {
      if (0 < (type->m_data).array.size) {
        iVar6 = 0;
        do {
          local_218 = local_208;
          pcVar4 = (local_230->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_218,pcVar4,pcVar4 + local_230->_M_string_length);
          std::__cxx11::string::append((char *)&local_218);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::ostream::operator<<(&local_1a8,iVar6);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
          uVar12 = 0xf;
          if (local_218 != local_208) {
            uVar12 = local_208[0];
          }
          if (uVar12 < (ulong)(local_1c8 + local_210)) {
            uVar12 = 0xf;
            if (local_1d0 != local_1c0) {
              uVar12 = local_1c0[0];
            }
            if (uVar12 < (ulong)(local_1c8 + local_210)) goto LAB_006655ca;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_218)
            ;
          }
          else {
LAB_006655ca:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1d0);
          }
          local_1f8 = &local_1e8;
          plVar9 = puVar8 + 2;
          if ((long *)*puVar8 == plVar9) {
            local_1e8 = *plVar9;
            uStack_1e0 = puVar8[3];
          }
          else {
            local_1e8 = *plVar9;
            local_1f8 = (long *)*puVar8;
          }
          local_1f0 = puVar8[1];
          *puVar8 = plVar9;
          puVar8[1] = 0;
          *(undefined1 *)plVar9 = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_1f8);
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          psVar10 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_258.field_2._M_allocated_capacity = *psVar10;
            local_258.field_2._8_8_ = plVar9[3];
          }
          else {
            local_258.field_2._M_allocated_capacity = *psVar10;
            local_258._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_258._M_string_length = plVar9[1];
          *plVar9 = (long)psVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          iVar7 = computeReferenceLayout
                            (local_238,curBlockNdx,baseOffset_00,&local_258,
                             (type->m_data).array.elementType,layoutFlags);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if (local_1f8 != &local_1e8) {
            operator_delete(local_1f8,local_1e8 + 1);
          }
          if (local_1d0 != local_1c0) {
            operator_delete(local_1d0,local_1c0[0] + 1);
          }
          if (local_218 != local_208) {
            operator_delete(local_218,local_208[0] + 1);
          }
          baseOffset_00 = baseOffset_00 + iVar7;
          iVar6 = iVar6 + 1;
          layoutFlags = (deUint32)local_220;
        } while (iVar6 < (type->m_data).array.size);
      }
      goto LAB_0066594b;
    }
    DVar2 = (pVVar3->m_data).basic.type;
    if (8 < DVar2 - TYPE_DOUBLE_MAT2 && 8 < DVar2 - TYPE_FLOAT_MAT2) {
      local_1a8.name._M_dataplus._M_p = (pointer)&local_1a8.name.field_2;
      local_1a8.name._M_string_length = 0;
      local_1a8.name.field_2._M_allocated_capacity =
           (ulong)(uint7)local_1a8.name.field_2._M_allocated_capacity._1_7_ << 8;
      local_1a8.type = TYPE_LAST;
      local_1a8.blockNdx = -1;
      local_1a8.offset = -1;
      local_1a8.arraySize = -1;
      local_1a8.arrayStride = -1;
      local_1a8.matrixStride = -1;
      local_1a8.topLevelArraySize = -1;
      local_1a8.topLevelArrayStride = -1;
      local_1a8.isRowMajor = false;
      pcVar4 = (local_230->_M_dataplus)._M_p;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      local_228 = uVar13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,pcVar4,pcVar4 + local_230->_M_string_length);
      std::__cxx11::string::append((char *)&local_258);
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      iVar6 = (type->m_data).array.size;
      iVar7 = (int)local_228;
      local_1a8.arrayStride = iVar7;
      local_1a8.arraySize = iVar6;
      local_1a8.matrixStride = 0;
      local_1a8.topLevelArraySize = 1;
      local_1a8.topLevelArrayStride = 0;
      local_1a8.type = DVar2;
      local_1a8.blockNdx = curBlockNdx;
      local_1a8.offset = baseOffset_00;
      std::
      vector<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
      ::push_back(&local_238->bufferVars,&local_1a8);
      iVar6 = iVar6 * iVar7;
      goto LAB_0066592c;
    }
    local_220 = type;
    if ((layoutFlags & 0x10) == 0) {
      local_228 = uVar13;
      iVar7 = glu::getDataTypeMatrixNumColumns(DVar2);
    }
    else {
      local_228 = uVar13;
      iVar7 = glu::getDataTypeMatrixNumRows(DVar2);
    }
    local_1a8.name._M_dataplus._M_p = (pointer)&local_1a8.name.field_2;
    local_1a8.name._M_string_length = 0;
    local_1a8.name.field_2._M_allocated_capacity =
         local_1a8.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1a8.type = TYPE_LAST;
    local_1a8.blockNdx = -1;
    local_1a8.offset = -1;
    local_1a8.arraySize = -1;
    local_1a8.arrayStride = -1;
    local_1a8.matrixStride = -1;
    local_1a8.topLevelArraySize = -1;
    local_1a8.topLevelArrayStride = -1;
    local_1a8.isRowMajor = false;
    pcVar4 = (local_230->_M_dataplus)._M_p;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,pcVar4,pcVar4 + local_230->_M_string_length);
    std::__cxx11::string::append((char *)&local_258);
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    iVar6 = (local_220->m_data).array.size;
    local_1a8.matrixStride = (int)local_228;
    iVar7 = iVar7 * local_1a8.matrixStride;
    local_1a8.arrayStride = iVar7;
    local_1a8.arraySize = iVar6;
    local_1a8.isRowMajor = SUB41((layoutFlags & 0x10) >> 4,0);
    local_1a8.topLevelArraySize = 1;
    local_1a8.topLevelArrayStride = 0;
    local_1a8.type = DVar2;
    local_1a8.blockNdx = curBlockNdx;
    local_1a8.offset = baseOffset_00;
    std::
    vector<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
    ::push_back(&local_238->bufferVars,&local_1a8);
    iVar6 = iVar6 * iVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.name._M_dataplus._M_p != &local_1a8.name.field_2) goto LAB_00665939;
  }
  else {
    if (type->m_type != TYPE_BASIC) {
      pSVar14 = (((type->m_data).structPtr)->m_members).
                super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_228 = uVar13;
      if (pSVar14 !=
          (((type->m_data).structPtr)->m_members).
          super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        paVar1 = &local_1a8.name.field_2;
        do {
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          pcVar4 = (local_230->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_258,pcVar4,pcVar4 + local_230->_M_string_length);
          std::__cxx11::string::append((char *)&local_258);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_258);
          puVar11 = (ulong *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar11) {
            local_1a8.name.field_2._M_allocated_capacity = *puVar11;
            local_1a8.name.field_2._8_8_ = plVar9[3];
            local_1a8.name._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_1a8.name.field_2._M_allocated_capacity = *puVar11;
            local_1a8.name._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_1a8.name._M_string_length = plVar9[1];
          *plVar9 = (long)puVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          iVar6 = computeReferenceLayout
                            (local_238,curBlockNdx,baseOffset_00,&local_1a8.name,&pSVar14->m_type,
                             (deUint32)local_220);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8.name._M_dataplus._M_p != paVar1) {
            operator_delete(local_1a8.name._M_dataplus._M_p,
                            local_1a8.name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          baseOffset_00 = iVar6 + baseOffset_00;
          pSVar14 = pSVar14 + 1;
        } while (pSVar14 !=
                 (((type->m_data).structPtr)->m_members).
                 super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      baseOffset_00 = ((int)local_228 + baseOffset_00) - 1 & local_1d4;
      goto LAB_0066594b;
    }
    DVar2 = (type->m_data).basic.type;
    local_1a8.name._M_dataplus._M_p = (pointer)&local_1a8.name.field_2;
    local_1a8.name._M_string_length = 0;
    local_1a8.name.field_2._M_allocated_capacity =
         (ulong)(uint7)local_1a8.name.field_2._M_allocated_capacity._1_7_ << 8;
    local_1a8.type = TYPE_LAST;
    local_1a8.blockNdx = -1;
    local_1a8.offset = -1;
    local_1a8.arraySize = -1;
    local_1a8.arrayStride = -1;
    local_1a8.matrixStride = -1;
    local_1a8.topLevelArraySize = -1;
    local_1a8.topLevelArrayStride = -1;
    local_1a8.isRowMajor = false;
    std::__cxx11::string::_M_assign((string *)&local_1a8);
    local_1a8.arraySize = 1;
    local_1a8.arrayStride = 0;
    local_1a8.matrixStride = 0;
    local_1a8.topLevelArraySize = 1;
    local_1a8.topLevelArrayStride = 0;
    local_1a8.type = DVar2;
    if (DVar2 - TYPE_FLOAT_MAT2 < 9 || DVar2 - TYPE_DOUBLE_MAT2 < 9) {
      if ((layoutFlags & 0x10) == 0) {
        local_1a8.blockNdx = curBlockNdx;
        iVar6 = glu::getDataTypeMatrixNumColumns(DVar2);
      }
      else {
        local_1a8.blockNdx = curBlockNdx;
        iVar6 = glu::getDataTypeMatrixNumRows(DVar2);
      }
      local_1a8.isRowMajor = SUB41((layoutFlags & 0x10) >> 4,0);
      iVar6 = iVar6 * uVar5;
      local_1a8.offset = baseOffset_00;
      local_1a8.matrixStride = uVar5;
    }
    else {
      local_1a8.blockNdx = curBlockNdx;
      local_1a8.offset = baseOffset_00;
      iVar6 = glu::getDataTypeScalarSize(DVar2);
      iVar6 = iVar6 << 2;
    }
    std::
    vector<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
    ::push_back(&local_238->bufferVars,&local_1a8);
LAB_0066592c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.name._M_dataplus._M_p != &local_1a8.name.field_2) {
LAB_00665939:
      operator_delete(local_1a8.name._M_dataplus._M_p,
                      local_1a8.name.field_2._M_allocated_capacity + 1);
    }
  }
  baseOffset_00 = baseOffset_00 + iVar6;
LAB_0066594b:
  return baseOffset_00 - (int)local_1b0;
}

Assistant:

int computeReferenceLayout (
	BufferLayout&		layout,
	int					curBlockNdx,
	int					baseOffset,
	const std::string&	curPrefix,
	const VarType&		type,
	deUint32			layoutFlags)
{
	// Reference layout uses std430 rules by default. std140 rules are
	// choosen only for blocks that have std140 layout.
	const bool	isStd140			= (layoutFlags & LAYOUT_STD140) != 0;
	const int	baseAlignment		= isStd140 ? computeStd140BaseAlignment(type, layoutFlags)
											   : computeStd430BaseAlignment(type, layoutFlags);
	int			curOffset			= deAlign32(baseOffset, baseAlignment);
	const int	topLevelArraySize	= 1; // Default values
	const int	topLevelArrayStride	= 0;

	if (type.isBasicType())
	{
		const glu::DataType		basicType	= type.getBasicType();
		BufferVarLayoutEntry	entry;

		entry.name					= curPrefix;
		entry.type					= basicType;
		entry.arraySize				= 1;
		entry.arrayStride			= 0;
		entry.matrixStride			= 0;
		entry.topLevelArraySize		= topLevelArraySize;
		entry.topLevelArrayStride	= topLevelArrayStride;
		entry.blockNdx				= curBlockNdx;

		if (glu::isDataTypeMatrix(basicType))
		{
			// Array of vectors as specified in rules 5 & 7.
			const bool	isRowMajor			= !!(layoutFlags & LAYOUT_ROW_MAJOR);
			const int	numVecs				= isRowMajor ? glu::getDataTypeMatrixNumRows(basicType)
														 : glu::getDataTypeMatrixNumColumns(basicType);

			entry.offset		= curOffset;
			entry.matrixStride	= baseAlignment;
			entry.isRowMajor	= isRowMajor;

			curOffset += numVecs*baseAlignment;
		}
		else
		{
			// Scalar or vector.
			entry.offset = curOffset;

			curOffset += getDataTypeByteSize(basicType);
		}

		layout.bufferVars.push_back(entry);
	}
	else if (type.isArrayType())
	{
		const VarType&	elemType	= type.getElementType();

		if (elemType.isBasicType() && !glu::isDataTypeMatrix(elemType.getBasicType()))
		{
			// Array of scalars or vectors.
			const glu::DataType		elemBasicType	= elemType.getBasicType();
			const int				stride			= baseAlignment;
			BufferVarLayoutEntry	entry;

			entry.name					= curPrefix + "[0]"; // Array variables are always postfixed with [0]
			entry.type					= elemBasicType;
			entry.blockNdx				= curBlockNdx;
			entry.offset				= curOffset;
			entry.arraySize				= type.getArraySize();
			entry.arrayStride			= stride;
			entry.matrixStride			= 0;
			entry.topLevelArraySize		= topLevelArraySize;
			entry.topLevelArrayStride	= topLevelArrayStride;

			curOffset += stride*type.getArraySize();

			layout.bufferVars.push_back(entry);
		}
		else if (elemType.isBasicType() && glu::isDataTypeMatrix(elemType.getBasicType()))
		{
			// Array of matrices.
			const glu::DataType			elemBasicType	= elemType.getBasicType();
			const bool					isRowMajor		= !!(layoutFlags & LAYOUT_ROW_MAJOR);
			const int					numVecs			= isRowMajor ? glu::getDataTypeMatrixNumRows(elemBasicType)
																	 : glu::getDataTypeMatrixNumColumns(elemBasicType);
			const int					vecStride		= baseAlignment;
			BufferVarLayoutEntry		entry;

			entry.name					= curPrefix + "[0]"; // Array variables are always postfixed with [0]
			entry.type					= elemBasicType;
			entry.blockNdx				= curBlockNdx;
			entry.offset				= curOffset;
			entry.arraySize				= type.getArraySize();
			entry.arrayStride			= vecStride*numVecs;
			entry.matrixStride			= vecStride;
			entry.isRowMajor			= isRowMajor;
			entry.topLevelArraySize		= topLevelArraySize;
			entry.topLevelArrayStride	= topLevelArrayStride;

			curOffset += numVecs*vecStride*type.getArraySize();

			layout.bufferVars.push_back(entry);
		}
		else
		{
			DE_ASSERT(elemType.isStructType() || elemType.isArrayType());

			for (int elemNdx = 0; elemNdx < type.getArraySize(); elemNdx++)
				curOffset += computeReferenceLayout(layout, curBlockNdx, curOffset, curPrefix + "[" + de::toString(elemNdx) + "]", type.getElementType(), layoutFlags);
		}
	}
	else
	{
		DE_ASSERT(type.isStructType());

		for (StructType::ConstIterator memberIter = type.getStructPtr()->begin(); memberIter != type.getStructPtr()->end(); memberIter++)
			curOffset += computeReferenceLayout(layout, curBlockNdx, curOffset, curPrefix + "." + memberIter->getName(), memberIter->getType(), layoutFlags);

		curOffset = deAlign32(curOffset, baseAlignment);
	}

	return curOffset-baseOffset;
}